

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

void SHA1_final(uchar *digest,SHA1Context *context)

{
  uchar local_24 [8];
  uchar finalcount [8];
  uint32_t i;
  SHA1Context *context_local;
  uchar *digest_local;
  
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 8; finalcount._0_4_ = finalcount._0_4_ + 1) {
    local_24[(uint)finalcount._0_4_] =
         (uchar)(context->count[(int)(uint)((uint)finalcount._0_4_ < 4)] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  unique0x10000188 = context;
  SHA1_update(context,(uchar *)anon_var_dwarf_2d38,1);
  while ((stack0xffffffffffffffe8->count[0] & 0x1f8) != 0x1c0) {
    SHA1_update(stack0xffffffffffffffe8,(uchar *)"",1);
  }
  SHA1_update(stack0xffffffffffffffe8,local_24,8);
  finalcount[0] = '\0';
  finalcount[1] = '\0';
  finalcount[2] = '\0';
  finalcount[3] = '\0';
  for (; (uint)finalcount._0_4_ < 0x14; finalcount._0_4_ = finalcount._0_4_ + 1) {
    digest[(uint)finalcount._0_4_] =
         (uchar)(stack0xffffffffffffffe8->state[(uint)finalcount._0_4_ >> 2] >>
                (('\x03' - ((byte)finalcount._0_4_ & 3)) * '\b' & 0x1f));
  }
  memset(stack0xffffffffffffffe8->buffer,0,0x40);
  memset(stack0xffffffffffffffe8,0,0x14);
  memset(stack0xffffffffffffffe8->count,0,8);
  memset(local_24,0,8);
  SHA1_transform(stack0xffffffffffffffe8->state,stack0xffffffffffffffe8->buffer);
  return;
}

Assistant:

static void SHA1_final(unsigned char digest[20], SHA1Context *context) {
    uint32_t i;
    unsigned char finalcount[8];

    for (i = 0; i < 8; i++) {
        finalcount[i] = (unsigned char)
                        ((context->count[(i >= 4 ? 0 : 1)] >>
                          ((3 - (i & 3)) * 8)) & 255);
    }

    SHA1_update(context, (unsigned char *) "\200", 1);

    while ((context->count[0] & 504) != 448) {
        SHA1_update(context, (unsigned char *) "\0", 1);
    }

    SHA1_update(context, finalcount, 8);

    for (i = 0; i < 20; i++) {
        digest[i] = (unsigned char)
                    ((context->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
    }

    memset(context->buffer, 0, 64);
    memset(context->state, 0, 20);
    memset(context->count, 0, 8);
    memset(&finalcount, 0, 8);

    SHA1_transform(context->state, context->buffer);
}